

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O1

void __thiscall
CfgNode::BlockData::addSignalHandler
          (BlockData *this,int sigid,CFG *handler,unsigned_long_long count)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr *pp_Var2;
  mapped_type pCVar3;
  mapped_type *ppCVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  int local_2c;
  
  local_2c = sigid;
  if (sigid < 0) {
    __assert_fail("sigid >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CfgNode.cpp"
                  ,0xb6,"void CfgNode::BlockData::addSignalHandler(int, CFG *, unsigned long long)")
    ;
  }
  p_Var1 = &(this->m_signalHandlers)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = (this->m_signalHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &p_Var1->_M_header;
  for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < sigid]) {
    if (sigid <= (int)p_Var6[1]._M_color) {
      p_Var5 = p_Var6;
    }
  }
  p_Var6 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var5 != p_Var1) && (p_Var6 = p_Var5, sigid < (int)p_Var5[1]._M_color)) {
    p_Var6 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var6 == p_Var1) {
    pCVar3 = (mapped_type)operator_new(0x20);
    pCVar3->_vptr_CfgSignalHandler = (_func_int **)&PTR__CfgSignalHandler_0012a8a8;
    pCVar3->m_sigid = sigid;
    pCVar3->m_handler = handler;
    pCVar3->m_count = count;
    ppCVar4 = std::
              map<int,_CfgSignalHandler_*,_std::less<int>,_std::allocator<std::pair<const_int,_CfgSignalHandler_*>_>_>
              ::operator[](&this->m_signalHandlers,&local_2c);
    *ppCVar4 = pCVar3;
  }
  else {
    if ((p_Var6[1]._M_parent)->_M_left->_M_parent != (_Base_ptr)handler->m_addr) {
      __assert_fail("cfgSignalHandler->handler()->addr() == handler->addr()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CfgNode.cpp"
                    ,0xbb,
                    "void CfgNode::BlockData::addSignalHandler(int, CFG *, unsigned long long)");
    }
    pp_Var2 = &(p_Var6[1]._M_parent)->_M_right;
    *pp_Var2 = (_Base_ptr)((long)&(*pp_Var2)->_M_color + count);
  }
  return;
}

Assistant:

void CfgNode::BlockData::addSignalHandler(int sigid, CFG* handler, unsigned long long count) {
	assert(sigid >= 0);

	std::map<int, CfgSignalHandler*>::const_iterator it = m_signalHandlers.find(sigid);
	if (it != m_signalHandlers.end()) {
		CfgSignalHandler* cfgSignalHandler = it->second;
		assert(cfgSignalHandler->handler()->addr() == handler->addr());
		cfgSignalHandler->updateCount(count);
	} else {
		CfgSignalHandler* cfgSignalHandler = new CfgSignalHandler(sigid, handler, count);
		m_signalHandlers[sigid] = cfgSignalHandler;
	}
}